

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

void __thiscall huelang::Environment::Run(Environment *this)

{
  bool bVar1;
  Word WVar2;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  Word preevalword;
  Environment *this_local;
  
  preevalword.minor = (unsigned_long)this;
  while( true ) {
    bVar1 = std::stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>::
            empty(&(this->executionStack).
                   super_stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>
                 );
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"preeval",&local_41);
    WVar2 = DefinitionTable::TokToWord(&this->definitionTable,&local_40);
    preevalword._0_8_ = WVar2.minor;
    local_20._0_2_ = WVar2.major;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>::push
              (&(this->executionStack).
                super_stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>
               ,(value_type *)local_20);
    Evaluate(this);
    Evaluate(this);
  }
  return;
}

Assistant:

void Environment::Run() {
        while (!executionStack.empty()) {
            Word preevalword = definitionTable.TokToWord(PREEVALWORD);
            executionStack.push(preevalword);
            Evaluate();
            Evaluate();
        }
    }